

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void TrackMemberNodesInObjectForIntConstants
               (ByteCodeGenerator *byteCodeGenerator,ParseNodePtr objNode)

{
  ParseNode *this;
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId_00;
  undefined4 *puVar3;
  ParseNodeUni *pPVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStr *pPVar6;
  ParseNodePtr local_50;
  ParseNode *local_48;
  PropertyId propertyId;
  ParseNodePtr memberValNode;
  ParseNodePtr memberNameNode;
  ParseNodePtr memberNode;
  ParseNodePtr memberList;
  ParseNodePtr objNode_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  if (objNode->nop != knopObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x2b0d,"(objNode->nop == knopObject)","objNode->nop == knopObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pPVar4 = ParseNode::AsParseNodeUni(objNode);
  memberNode = pPVar4->pnode1;
  while (memberNode != (ParseNodePtr)0x0) {
    if (memberNode->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(memberNode);
      local_48 = pPVar5->pnode1;
    }
    else {
      local_48 = memberNode;
    }
    if (local_48->nop != knopEllipsis) {
      pPVar5 = ParseNode::AsParseNodeBin(local_48);
      this = pPVar5->pnode1;
      pPVar5 = ParseNode::AsParseNodeBin(local_48);
      if ((this->nop != knopComputedName) && (pPVar5->pnode2->nop == knopInt)) {
        pPVar6 = ParseNode::AsParseNodeStr(this);
        propertyId_00 = Ident::GetPropertyId(pPVar6->pid);
        TrackIntConstantsOnGlobalUserObject(byteCodeGenerator,true,propertyId_00);
      }
    }
    if (memberNode->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(memberNode);
      local_50 = pPVar5->pnode2;
    }
    else {
      local_50 = (ParseNodePtr)0x0;
    }
    memberNode = local_50;
  }
  return;
}

Assistant:

void TrackMemberNodesInObjectForIntConstants(ByteCodeGenerator *byteCodeGenerator, ParseNodePtr objNode)
{
    Assert(objNode->nop == knopObject);

    ParseNodePtr memberList = objNode->AsParseNodeUni()->pnode1;

    while (memberList != nullptr)
    {
        ParseNodePtr memberNode = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode1 : memberList;
        if (memberNode->nop != knopEllipsis)
        {
            ParseNodePtr memberNameNode = memberNode->AsParseNodeBin()->pnode1;
            ParseNodePtr memberValNode = memberNode->AsParseNodeBin()->pnode2;

            if (memberNameNode->nop != knopComputedName && memberValNode->nop == knopInt)
            {
                Js::PropertyId propertyId = memberNameNode->AsParseNodeStr()->pid->GetPropertyId();
                TrackIntConstantsOnGlobalUserObject(byteCodeGenerator, true, propertyId);
            }
        }

        memberList = memberList->nop == knopList ? memberList->AsParseNodeBin()->pnode2 : nullptr;
    }
}